

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::LoadRepositories(cmCTestSVN *this)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_1a0 [8];
  OutputLogger err;
  ExternalParser out;
  char *local_38;
  undefined1 local_30 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  cmCTestSVN *this_local;
  
  svn_status.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar1 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::empty
                    (&this->Repositories);
  if (bVar1) {
    std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::emplace_back<>
              (&this->Repositories);
    pvVar2 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::back
                       (&this->Repositories);
    this->RootInfo = pvVar2;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
    local_38 = "status";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,&local_38);
    ExternalParser::ExternalParser
              ((ExternalParser *)&err.super_LineParser.Separator,this,"external-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_1a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "external-err> ");
    this_local._7_1_ =
         RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
                       (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_1a0);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1a0);
    ExternalParser::~ExternalParser((ExternalParser *)&err.super_LineParser.Separator);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::LoadRepositories()
{
  if (!this->Repositories.empty()) {
    return true;
  }

  // Info for root repository
  this->Repositories.emplace_back();
  this->RootInfo = &(this->Repositories.back());

  // Run "svn status" to get the list of external repositories
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  ExternalParser out(this, "external-out> ");
  OutputLogger err(this->Log, "external-err> ");
  return this->RunSVNCommand(svn_status, &out, &err);
}